

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.h
# Opt level: O2

TreeEnsembleParameters * __thiscall
CoreML::Specification::TreeEnsembleRegressor::mutable_treeensemble(TreeEnsembleRegressor *this)

{
  TreeEnsembleParameters *this_00;
  
  this_00 = this->treeensemble_;
  if (this_00 == (TreeEnsembleParameters *)0x0) {
    this_00 = (TreeEnsembleParameters *)operator_new(0x50);
    TreeEnsembleParameters::TreeEnsembleParameters(this_00);
    this->treeensemble_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::TreeEnsembleParameters* TreeEnsembleRegressor::mutable_treeensemble() {
  
  if (treeensemble_ == NULL) {
    treeensemble_ = new ::CoreML::Specification::TreeEnsembleParameters;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.TreeEnsembleRegressor.treeEnsemble)
  return treeensemble_;
}